

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_schnorrsig_verify
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_xonly_pubkey *pubkey)

{
  secp256k1_fe *r;
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int overflow;
  secp256k1_scalar s;
  secp256k1_fe rx;
  uchar buf [32];
  secp256k1_scalar e;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_ge pk;
  secp256k1_gej pkj;
  int local_2c4;
  secp256k1_scalar local_2c0;
  secp256k1_fe local_2a0;
  uchar local_278 [32];
  secp256k1_gej local_258;
  secp256k1_scalar local_1d8;
  secp256k1_fe local_1b8;
  secp256k1_fe local_190;
  secp256k1_fe local_168;
  secp256k1_fe local_140;
  undefined4 local_118;
  secp256k1_ge local_110;
  secp256k1_gej local_b8;
  
  if (sig64 == (uchar *)0x0) {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "sig64 != NULL";
  }
  else if (msglen == 0 || msg != (uchar *)0x0) {
    if (pubkey != (secp256k1_xonly_pubkey *)0x0) {
      iVar1 = secp256k1_fe_impl_set_b32_limit(&local_2a0,sig64);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_scalar_set_b32(&local_2c0,sig64 + 0x20,&local_2c4);
      if (local_2c4 != 0) {
        return 0;
      }
      iVar1 = secp256k1_pubkey_load(ctx,&local_110,(secp256k1_pubkey *)pubkey);
      if (iVar1 == 0) {
        return 0;
      }
      secp256k1_fe_impl_get_b32(local_278,&local_110.x);
      secp256k1_schnorrsig_challenge(&local_1d8,sig64,msg,msglen,local_278);
      secp256k1_scalar_negate(&local_1d8,&local_1d8);
      local_b8.infinity = local_110.infinity;
      local_b8.x.n[0] = local_110.x.n[0];
      local_b8.x.n[1] = local_110.x.n[1];
      local_b8.x.n[2] = local_110.x.n[2];
      local_b8.x.n[3] = local_110.x.n[3];
      local_b8.x.n[4] = local_110.x.n[4];
      local_b8.y.n[0] = local_110.y.n[0];
      local_b8.y.n[1] = local_110.y.n[1];
      local_b8.y.n[2] = local_110.y.n[2];
      local_b8.y.n[3] = local_110.y.n[3];
      local_b8.y.n[4] = local_110.y.n[4];
      local_b8.z.n[0] = 1;
      local_b8.z.n[1] = 0;
      local_b8.z.n[2] = 0;
      local_b8.z.n[3] = 0;
      local_b8.z.n[4] = 0;
      secp256k1_ecmult(&local_258,&local_b8,&local_1d8,&local_2c0);
      if (local_258.infinity != 0) {
        return 0;
      }
      r = &local_258.z;
      secp256k1_fe_impl_inv_var(r,r);
      secp256k1_fe_impl_sqr(&local_190,r);
      secp256k1_fe_impl_mul(&local_1b8,r,&local_190);
      secp256k1_fe_impl_mul(&local_258.x,&local_258.x,&local_190);
      secp256k1_fe_impl_mul(&local_258.y,&local_258.y,&local_1b8);
      local_118 = 0;
      local_168.n[0] = local_258.x.n[0];
      local_168.n[1] = local_258.x.n[1];
      local_168.n[2] = local_258.x.n[2];
      local_168.n[3] = local_258.x.n[3];
      local_168.n[4] = local_258.x.n[4];
      local_140.n[0] = local_258.y.n[0];
      local_140.n[1] = local_258.y.n[1];
      local_140.n[2] = local_258.y.n[2];
      local_140.n[3] = local_258.y.n[3];
      local_140.n[4] = local_258.y.n[4];
      secp256k1_fe_impl_normalize_var(&local_140);
      if ((local_140.n[0] & 1) == 0) {
        iVar1 = secp256k1_fe_equal(&local_2a0,&local_168);
        return iVar1;
      }
      return 0;
    }
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "pubkey != NULL";
  }
  else {
    pvVar2 = (ctx->illegal_callback).data;
    pcVar3 = "msg != NULL || msglen == 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar3,pvVar2);
  return 0;
}

Assistant:

int secp256k1_schnorrsig_verify(const secp256k1_context* ctx, const unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_xonly_pubkey *pubkey) {
    secp256k1_scalar s;
    secp256k1_scalar e;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_gej pkj;
    secp256k1_fe rx;
    secp256k1_ge r;
    unsigned char buf[32];
    int overflow;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(pubkey != NULL);

    if (!secp256k1_fe_set_b32_limit(&rx, &sig64[0])) {
        return 0;
    }

    secp256k1_scalar_set_b32(&s, &sig64[32], &overflow);
    if (overflow) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &pk, pubkey)) {
        return 0;
    }

    /* Compute e. */
    secp256k1_fe_get_b32(buf, &pk.x);
    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, buf);

    /* Compute rj =  s*G + (-e)*pkj */
    secp256k1_scalar_negate(&e, &e);
    secp256k1_gej_set_ge(&pkj, &pk);
    secp256k1_ecmult(&rj, &pkj, &e, &s);

    secp256k1_ge_set_gej_var(&r, &rj);
    if (secp256k1_ge_is_infinity(&r)) {
        return 0;
    }

    secp256k1_fe_normalize_var(&r.y);
    return !secp256k1_fe_is_odd(&r.y) &&
           secp256k1_fe_equal(&rx, &r.x);
}